

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

void cleanup_mon_spell(void)

{
  monster_spell *pmVar1;
  monster_spell_level *pmVar2;
  monster_spell_level *next_level;
  monster_spell_level *level;
  monster_spell *next;
  monster_spell *rs;
  
  next = monster_spells;
  while (next != (monster_spell *)0x0) {
    pmVar1 = next->next;
    next_level = next->level;
    free_effect(next->effect);
    while (next_level != (monster_spell_level *)0x0) {
      pmVar2 = next_level->next;
      string_free(next_level->lore_desc);
      string_free(next_level->message);
      string_free(next_level->blind_message);
      string_free(next_level->miss_message);
      string_free(next_level->save_message);
      mem_free(next_level);
      next_level = pmVar2;
    }
    mem_free(next);
    next = pmVar1;
  }
  return;
}

Assistant:

static void cleanup_mon_spell(void)
{
	struct monster_spell *rs = monster_spells;
	struct monster_spell *next;
	struct monster_spell_level *level;

	while (rs) {
		next = rs->next;
		level = rs->level;
		free_effect(rs->effect);
		while (level) {
			struct monster_spell_level *next_level = level->next;
			string_free(level->lore_desc);
			string_free(level->message);
			string_free(level->blind_message);
			string_free(level->miss_message);
			string_free(level->save_message);
			mem_free(level);
			level = next_level;
		}
		mem_free(rs);
		rs = next;
	}
}